

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

void __thiscall
backward::TraceResolverLinuxBase::TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  string local_38;
  
  (this->super_TraceResolverImplBase)._demangler.
  super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._val = (char *)0x0;
  (this->super_TraceResolverImplBase)._demangler.
  super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._empty = true;
  (this->super_TraceResolverImplBase)._demangler.
  super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer_length = 0;
  (this->super_TraceResolverImplBase)._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxBase_0010ec80;
  get_argv0_abi_cxx11_();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/proc/self/exe","");
  read_symlink(&this->exec_path_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}